

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_remove(JSON_Array *array,size_t ix)

{
  size_t sVar1;
  JSON_Value *value;
  size_t to_move_bytes;
  size_t ix_local;
  JSON_Array *array_local;
  
  if ((array != (JSON_Array *)0x0) && (sVar1 = json_array_get_count(array), ix < sVar1)) {
    value = json_array_get_value(array,ix);
    json_value_free(value);
    sVar1 = json_array_get_count(array);
    memmove(array->items + ix,array->items + ix + 1,((sVar1 - 1) - ix) * 8);
    array->count = array->count - 1;
    return 0;
  }
  return -1;
}

Assistant:

JSON_Status json_array_remove(JSON_Array *array, size_t ix) {
    size_t to_move_bytes = 0;
    if (array == NULL || ix >= json_array_get_count(array)) {
        return JSONFailure;
    }
    json_value_free(json_array_get_value(array, ix));
    to_move_bytes = (json_array_get_count(array) - 1 - ix) * sizeof(JSON_Value*);
    memmove(array->items + ix, array->items + ix + 1, to_move_bytes);
    array->count -= 1;
    return JSONSuccess;
}